

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::parseError(QXmlStreamReaderPrivate *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int s;
  int k;
  int tk;
  int nexpected;
  int ers;
  int nmax;
  QString exp_str;
  QString error_message;
  int expected [4];
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  Error in_stack_fffffffffffffda4;
  QXmlStreamReaderPrivate *in_stack_fffffffffffffda8;
  char *s_00;
  QLatin1String *in_stack_fffffffffffffdb0;
  QLatin1String *in_stack_fffffffffffffdb8;
  QString *in_stack_fffffffffffffdc0;
  QString *in_stack_fffffffffffffdc8;
  int local_20c;
  int in_stack_fffffffffffffdfc;
  QChar fillChar;
  int local_200;
  QChar local_1da;
  char local_1d8 [64];
  QLatin1String local_198 [4];
  QLatin1String local_158 [4];
  QString local_118 [2];
  QString local_d8 [2];
  QChar local_92 [21];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  int iVar2;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(in_RDI + 0x3f8) == 0) {
    QString::QString((QString *)0x645ddf);
    raiseError(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
               (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    QString::~QString((QString *)0x645e02);
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x645e6d);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x3c0) + (long)*(int *)(in_RDI + 0x3b0) * 4);
    local_200 = 0;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(short *)(in_RDI + 0x3f8) != 0x2b) {
      for (in_stack_fffffffffffffdfc = 0; in_stack_fffffffffffffdfc < 0x39;
          in_stack_fffffffffffffdfc = in_stack_fffffffffffffdfc + 1) {
        iVar1 = QXmlStreamGrammar::t_action(iVar2,in_stack_fffffffffffffdfc);
        if (((0 < iVar1) && (QXmlStreamGrammar::spell[in_stack_fffffffffffffdfc] != (char *)0x0)) &&
           (local_200 < 4)) {
          *(int *)((long)&local_18 + (long)local_200 * 4) = in_stack_fffffffffffffdfc;
          local_200 = local_200 + 1;
        }
      }
    }
    fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffdfc >> 0x10);
    if ((local_200 == 0) || (3 < local_200)) {
      QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                     (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd9c);
      s_00 = local_1d8;
      QLatin1String::QLatin1String(in_stack_fffffffffffffdb0,s_00);
      iVar2 = (int)((ulong)s_00 >> 0x20);
      QChar::QChar<char16_t,_true>(&local_1da,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,iVar2,fillChar);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QString::~QString((QString *)0x646465);
      QString::~QString((QString *)0x646472);
    }
    else {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                     (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd9c);
      QLatin1String::QLatin1String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      QChar::QChar<char16_t,_true>(local_92,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                 (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),fillChar);
      QString::~QString((QString *)0x646019);
      if (local_200 == 2) {
        QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                       (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd9c);
        in_stack_fffffffffffffdc8 = local_d8;
        QLatin1String::QLatin1String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        QString::arg<QString&,QLatin1String>
                  (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        QString::~QString((QString *)0x6460b1);
        QString::~QString((QString *)0x6460be);
      }
      else if (2 < local_200) {
        for (local_20c = 1; local_20c < local_200 + -1; local_20c = local_20c + 1) {
          QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                         (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffd9c);
          in_stack_fffffffffffffdc0 = local_118;
          QLatin1String::QLatin1String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          QString::arg<QString&,QLatin1String>
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          QString::~QString((QString *)0x6461da);
          QString::~QString((QString *)0x6461e7);
        }
        QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                       (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd9c);
        in_stack_fffffffffffffdb8 = local_158;
        QLatin1String::QLatin1String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        QString::arg<QString&,QLatin1String>
                  (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        QString::~QString((QString *)0x6462ad);
        QString::~QString((QString *)0x6462ba);
      }
      QXmlStream::tr((char *)in_stack_fffffffffffffda8,
                     (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd9c);
      QLatin1String::QLatin1String(local_198,(char *)in_stack_fffffffffffffda8);
      QString::arg<QString&,QLatin1String>
                (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QString::~QString((QString *)0x646371);
      QString::~QString((QString *)0x64637e);
      QString::~QString((QString *)0x64638b);
    }
    raiseWellFormedError
              ((QXmlStreamReaderPrivate *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    QString::~QString((QString *)0x6464b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::parseError()
{

    if (token == EOF_SYMBOL) {
        raiseError(QXmlStreamReader::PrematureEndOfDocumentError);
        return;
    }
    const int nmax = 4;
    QString error_message;
    int ers = state_stack[tos];
    int nexpected = 0;
    int expected[nmax];
    if (token != XML_ERROR)
        for (int tk = 0; tk < TERMINAL_COUNT; ++tk) {
            int k = t_action(ers, tk);
            if (k <= 0)
                continue;
            if (spell[tk]) {
                if (nexpected < nmax)
                    expected[nexpected++] = tk;
            }
        }

    if (nexpected && nexpected < nmax) {
        //: '<first option>'
        QString exp_str = QXmlStream::tr("'%1'", "expected")
                .arg(QLatin1StringView(spell[expected[0]]));
        if (nexpected == 2) {
            //: <first option>, '<second option>'
            exp_str = QXmlStream::tr("%1 or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[1]]));
        } else if (nexpected > 2) {
            int s = 1;
            for (; s < nexpected - 1; ++s) {
                //: <options so far>, '<next option>'
                exp_str = QXmlStream::tr("%1, '%2'", "expected")
                        .arg(exp_str, QLatin1StringView(spell[expected[s]]));
            }
            //: <options so far>, or '<final option>'
            exp_str = QXmlStream::tr("%1, or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[s]]));
        }
        error_message = QXmlStream::tr("Expected %1, but got '%2'.")
                .arg(exp_str, QLatin1StringView(spell[token]));
    } else {
        error_message = QXmlStream::tr("Unexpected '%1'.").arg(QLatin1StringView(spell[token]));
    }

    raiseWellFormedError(error_message);
}